

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O2

Image * Image_Function::Median(Image *__return_storage_ptr__,Image *in,uint32_t kernelSize)

{
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (__return_storage_ptr__,in->_width,in->_height,'\x01','\x01');
  Median(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
         __return_storage_ptr__->_height,kernelSize);
  return __return_storage_ptr__;
}

Assistant:

Image Median( const Image & in, uint32_t kernelSize )
    {
        ParameterValidation( in );

        Image out( in.width(), in.height() );

        Median( in, 0, 0, out, 0, 0, out.width(), out.height(), kernelSize );

        return out;
    }